

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

word256 * w256_from_bitstream(bitstream_t *bs,size_t width,size_t size)

{
  uint64_t uVar1;
  ulong in_RDX;
  long in_RSI;
  bitstream_t *in_RDI;
  size_t bits;
  uint64_t *d;
  uint64_t buf [4];
  ulong local_90;
  uint64_t *local_88;
  uint64_t local_80 [6];
  ulong local_50;
  long local_48;
  bitstream_t *local_40;
  
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  memset(local_80,0,0x20);
  local_88 = local_80 + local_48 + -1;
  for (local_90 = local_50; 0x3f < local_90; local_90 = local_90 - 0x40) {
    uVar1 = bitstream_get_bits(local_40,0x40);
    *local_88 = uVar1;
    local_88 = local_88 + -1;
  }
  if (local_90 != 0) {
    uVar1 = bitstream_get_bits(local_40,(uint)local_90);
    *local_88 = uVar1 << (0x40U - (char)local_90 & 0x3f);
  }
  return (word256 *)local_80;
}

Assistant:

ATTR_TARGET_S256
static inline word256 w256_from_bitstream(bitstream_t* bs, const size_t width, const size_t size) {
  ATTR_ALIGNED(32) uint64_t buf[4] = {0};
  uint64_t* d                      = &buf[width - 1];
  size_t bits                      = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    *d = bitstream_get_bits(bs, sizeof(uint64_t) * 8);
  }
  if (bits) {
    *d = bitstream_get_bits(bs, bits) << (sizeof(uint64_t) * 8 - bits);
  }

  return mm256_load(&buf[0]);
}